

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteUnittest.cpp
# Opt level: O1

void __thiscall ReadWriteUnittest::FillFields(ReadWriteUnittest *this)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  if (0 < this->iSize) {
    iVar4 = 0;
    iVar5 = 0;
    do {
      if (0 < this->jSize) {
        piVar1 = (this->fieldInt3).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (this->fieldDouble3).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar3 = (this->fieldFloat3).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar9 = 0;
        iVar10 = iVar5;
        do {
          if (0 < this->kSize) {
            iVar11 = 0;
            iVar6 = iVar10;
            do {
              piVar1[(this->jSize * iVar11 + iVar9) * this->iSize + iVar5] = iVar6;
              iVar7 = (this->jSize * iVar11 + iVar9) * this->iSize + iVar5;
              pdVar2[iVar7] =
                   (double)iVar11 * -12.5 * (double)iVar5 +
                   (double)iVar5 * 1.125 + (double)iVar9 * 2.25;
              pfVar3[iVar7] =
                   (float)iVar11 * -16.0 * (float)iVar5 + (float)iVar5 * 1.5 + (float)iVar9 * 4.25;
              iVar11 = iVar11 + 1;
              iVar6 = iVar6 + iVar4;
            } while (iVar11 < this->kSize);
          }
          iVar9 = iVar9 + 1;
          iVar10 = iVar10 + 2;
        } while (iVar9 < this->jSize);
      }
      iVar5 = iVar5 + 1;
      iVar4 = iVar4 + -0xc;
    } while (iVar5 < this->iSize);
  }
  if (0 < this->iSize) {
    piVar1 = (this->fieldInt2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = 0;
    iVar5 = 0;
    do {
      if (0 < this->kSize) {
        iVar9 = 0;
        iVar10 = iVar5;
        do {
          piVar1[this->iSize * iVar9 + iVar5] = iVar10;
          iVar9 = iVar9 + 1;
          iVar10 = iVar10 + iVar4;
        } while (iVar9 < this->kSize);
      }
      iVar5 = iVar5 + 1;
      iVar4 = iVar4 + -0xc;
    } while (iVar5 < this->iSize);
  }
  iVar4 = this->jSize;
  if (0 < (long)iVar4) {
    pdVar2 = (this->fieldDouble1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (this->fieldFloat1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      iVar5 = (int)lVar8 * (int)lVar8;
      pdVar2[lVar8] = (double)iVar5 + 2.875;
      pfVar3[lVar8] = (float)iVar5 + 3.5;
      lVar8 = lVar8 + 1;
    } while (iVar4 != lVar8);
  }
  return;
}

Assistant:

void FillFields() {
        for (int i = 0; i < iSize; ++i)
            for (int j = 0; j < jSize; ++j)
                for (int k = 0; k < kSize; ++k)
                {
                    fieldInt3[i + j*iSize + k*iSize*jSize] = i + 2*j - 12*k*i;
                    fieldDouble3[i + j*iSize + k*iSize*jSize] = 1.125*i + 2.25*j - 12.5*k*i;
                    fieldFloat3[i + j*iSize + k*iSize*jSize] = 1.5f*i + 4.25f*j - 16.0f*k*i;
                }

        for (int i = 0; i < iSize; ++i)
            for (int k = 0; k < kSize; ++k)
            {
                fieldInt2[i + k*iSize] = i - 12*k*i;
            }

        for (int j = 0; j < jSize; ++j)
        {
            fieldDouble1[j] = j*j+2.875;
            fieldFloat1[j] = j*j+3.5f;
        }
    }